

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_zip.c
# Opt level: O0

exr_result_t
internal_exr_undo_zip
          (exr_decode_pipeline_t *decode,void *compressed_data,uint64_t comp_buf_size,
          void *uncompressed_data,uint64_t uncompressed_size)

{
  exr_decode_pipeline_t *in_RCX;
  size_t *in_RDX;
  exr_decode_pipeline_t *in_RSI;
  long in_RDI;
  size_t *in_R8;
  uint64_t unaff_retaddr;
  uint64_t scratchbufsz;
  exr_result_t rv;
  size_t *scratch_data;
  uint in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 local_4;
  
  scratch_data = in_R8;
  if (in_R8 < in_RDX) {
    scratch_data = in_RDX;
  }
  if (in_RDX == in_R8) {
    *(size_t **)(in_RDI + 0x68) = in_RDX;
    if (in_RSI != in_RCX) {
      memcpy(in_RCX,in_RSI,(size_t)in_RDX);
    }
    local_4 = 0;
  }
  else {
    local_4 = internal_decode_alloc_buffer
                        (in_RSI,(exr_transcoding_pipeline_buffer_id_t)((ulong)in_RDX >> 0x20),
                         (void **)in_RCX,in_R8,
                         CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (local_4 == 0) {
      local_4 = undo_zip_impl(in_RSI,in_RDX,(uint64_t)in_RCX,in_R8,(ulong)in_stack_ffffffffffffffc8,
                              scratch_data,unaff_retaddr);
    }
  }
  return local_4;
}

Assistant:

exr_result_t
internal_exr_undo_zip (
    exr_decode_pipeline_t* decode,
    const void*            compressed_data,
    uint64_t               comp_buf_size,
    void*                  uncompressed_data,
    uint64_t               uncompressed_size)
{
    exr_result_t rv;
    uint64_t     scratchbufsz = uncompressed_size;
    if (comp_buf_size > scratchbufsz) scratchbufsz = comp_buf_size;

    if (comp_buf_size == uncompressed_size)
    {
        decode->bytes_decompressed = comp_buf_size;
        if (compressed_data != uncompressed_data)
            memcpy(uncompressed_data, compressed_data, comp_buf_size);
        return EXR_ERR_SUCCESS;
    }

    rv = internal_decode_alloc_buffer (
        decode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(decode->scratch_buffer_1),
        &(decode->scratch_alloc_size_1),
        scratchbufsz);
    if (rv != EXR_ERR_SUCCESS) return rv;
    return undo_zip_impl (
        decode,
        compressed_data,
        comp_buf_size,
        uncompressed_data,
        uncompressed_size,
        decode->scratch_buffer_1,
        decode->scratch_alloc_size_1);
}